

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

bool helics::changeDetected
               (defV *prevValue,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val,
               double deltaV)

{
  char *pcVar1;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *this;
  size_type sVar2;
  size_type sVar3;
  complex<double> *pcVar4;
  const_reference __x;
  int in_EDX;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_RSI;
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  size_t ii;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *prevV;
  complex<double> *__z;
  complex<double> *local_30;
  
  pcVar1 = std::
           variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
           ::index(in_RDI,(char *)in_RSI,in_EDX);
  if (pcVar1 == (char *)0x5) {
    this = std::
           get<std::vector<std::complex<double>,std::allocator<std::complex<double>>>,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                     ((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                       *)0x2b1a72);
    sVar2 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (in_RSI);
    sVar3 = CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)this)
    ;
    if (sVar2 == sVar3) {
      local_30 = (complex<double> *)0x0;
      while( true ) {
        __z = local_30;
        pcVar4 = (complex<double> *)
                 CLI::std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                 size(in_RSI);
        if (pcVar4 <= __z) {
          return false;
        }
        __x = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                        (this,(size_type)local_30);
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)in_RSI,
                   (size_type)local_30);
        std::operator-((complex<double> *)__x,(complex<double> *)0x2b1af9);
        dVar5 = std::abs<double>(__z);
        if (in_XMM0_Qa < dVar5) break;
        local_30 = (complex<double> *)(local_30->_M_value + 1);
      }
      return true;
    }
  }
  return true;
}

Assistant:

bool changeDetected(const defV& prevValue,
                    const std::vector<std::complex<double>>& val,
                    double deltaV)
{
    if (prevValue.index() == complex_vector_loc) {
        const auto& prevV = std::get<std::vector<std::complex<double>>>(prevValue);
        if (val.size() == prevV.size()) {
            for (size_t ii = 0; ii < val.size(); ++ii) {
                if (std::abs(prevV[ii] - val[ii]) > deltaV) {
                    return true;
                }
            }
            return false;
        }
    }
    return true;
}